

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.c
# Opt level: O2

xmlDtdPtr xmlCtxtParseDtd(xmlParserCtxtPtr ctxt,xmlParserInputPtr input,xmlChar *publicId,
                         xmlChar *systemId)

{
  _xmlNode *p_Var1;
  int iVar2;
  xmlDocPtr pxVar3;
  xmlDtdPtr pxVar4;
  _xmlNode **pp_Var5;
  _xmlDtd *p_Var6;
  
  if (ctxt == (xmlParserCtxtPtr)0x0 || input == (xmlParserInputPtr)0x0) {
    p_Var6 = (_xmlDtd *)0x0;
    xmlFatalErr(ctxt,XML_ERR_ARGUMENT,(char *)0x0);
    goto LAB_0013a3de;
  }
  iVar2 = xmlCtxtPushInput(ctxt,input);
  if (iVar2 < 0) {
    xmlFreeInputStream(input);
    return (xmlDtdPtr)0x0;
  }
  if (publicId == (xmlChar *)0x0) {
    publicId = (xmlChar *)"none";
  }
  if (systemId == (xmlChar *)0x0) {
    systemId = (xmlChar *)"none";
  }
  pxVar3 = xmlNewDoc("1.0");
  ctxt->myDoc = pxVar3;
  if (pxVar3 == (xmlDocPtr)0x0) {
    xmlCtxtErrMemory(ctxt);
LAB_0013a3d0:
    p_Var6 = (_xmlDtd *)0x0;
  }
  else {
    pxVar3->properties = 0x40;
    pxVar4 = xmlNewDtd(pxVar3,(xmlChar *)"none",publicId,systemId);
    ctxt->myDoc->extSubset = pxVar4;
    if (pxVar4 == (xmlDtdPtr)0x0) {
      xmlCtxtErrMemory(ctxt);
      xmlFreeDoc(ctxt->myDoc);
      goto LAB_0013a3d0;
    }
    xmlParseExternalSubset(ctxt,publicId,systemId);
    pxVar3 = ctxt->myDoc;
    if (ctxt->wellFormed == 0) {
LAB_0013a3b3:
      p_Var6 = (_xmlDtd *)0x0;
    }
    else {
      p_Var6 = pxVar3->extSubset;
      pxVar3->extSubset = (_xmlDtd *)0x0;
      if (p_Var6 == (_xmlDtd *)0x0) goto LAB_0013a3b3;
      p_Var6->doc = (_xmlDoc *)0x0;
      pp_Var5 = &p_Var6->children;
      while (p_Var1 = *pp_Var5, p_Var1 != (_xmlNode *)0x0) {
        p_Var1->doc = (_xmlDoc *)0x0;
        pp_Var5 = &p_Var1->next;
      }
    }
    xmlFreeDoc(pxVar3);
    ctxt->myDoc = (xmlDocPtr)0x0;
  }
  input = xmlCtxtPopInput(ctxt);
LAB_0013a3de:
  xmlFreeInputStream(input);
  return p_Var6;
}

Assistant:

xmlDtdPtr
xmlCtxtParseDtd(xmlParserCtxtPtr ctxt, xmlParserInputPtr input,
                const xmlChar *publicId, const xmlChar *systemId) {
    xmlDtdPtr ret = NULL;

    if ((ctxt == NULL) || (input == NULL)) {
        xmlFatalErr(ctxt, XML_ERR_ARGUMENT, NULL);
        xmlFreeInputStream(input);
        return(NULL);
    }

    if (xmlCtxtPushInput(ctxt, input) < 0) {
        xmlFreeInputStream(input);
        return(NULL);
    }

    if (publicId == NULL)
        publicId = BAD_CAST "none";
    if (systemId == NULL)
        systemId = BAD_CAST "none";

    ctxt->myDoc = xmlNewDoc(BAD_CAST "1.0");
    if (ctxt->myDoc == NULL) {
        xmlErrMemory(ctxt);
        goto error;
    }
    ctxt->myDoc->properties = XML_DOC_INTERNAL;
    ctxt->myDoc->extSubset = xmlNewDtd(ctxt->myDoc, BAD_CAST "none",
                                       publicId, systemId);
    if (ctxt->myDoc->extSubset == NULL) {
        xmlErrMemory(ctxt);
        xmlFreeDoc(ctxt->myDoc);
        goto error;
    }

    xmlParseExternalSubset(ctxt, publicId, systemId);

    if (ctxt->wellFormed) {
        ret = ctxt->myDoc->extSubset;
        ctxt->myDoc->extSubset = NULL;
        if (ret != NULL) {
            xmlNodePtr tmp;

            ret->doc = NULL;
            tmp = ret->children;
            while (tmp != NULL) {
                tmp->doc = NULL;
                tmp = tmp->next;
            }
        }
    } else {
        ret = NULL;
    }
    xmlFreeDoc(ctxt->myDoc);
    ctxt->myDoc = NULL;

error:
    xmlFreeInputStream(xmlCtxtPopInput(ctxt));

    return(ret);
}